

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::RenderFragmentUniformTexelBuffer::~RenderFragmentUniformTexelBuffer
          (RenderFragmentUniformTexelBuffer *this)

{
  DeviceInterface *pDVar1;
  VkDevice pVVar2;
  ulong uVar3;
  bool bVar4;
  size_type sVar5;
  reference pvVar6;
  Handle<(vk::HandleType)12> local_28;
  deUint64 local_20;
  ulong local_18;
  size_t bufferViewNdx;
  RenderFragmentUniformTexelBuffer *this_local;
  
  (this->super_RenderPassCommand)._vptr_RenderPassCommand =
       (_func_int **)&PTR__RenderFragmentUniformTexelBuffer_016aa3d8;
  local_18 = 0;
  bufferViewNdx = (size_t)this;
  while( true ) {
    uVar3 = local_18;
    sVar5 = std::
            vector<vk::Handle<(vk::HandleType)12>,_std::allocator<vk::Handle<(vk::HandleType)12>_>_>
            ::size(&this->m_bufferViews);
    if (sVar5 <= uVar3) break;
    pvVar6 = std::
             vector<vk::Handle<(vk::HandleType)12>,_std::allocator<vk::Handle<(vk::HandleType)12>_>_>
             ::operator[](&this->m_bufferViews,local_18);
    bVar4 = ::vk::Handle<(vk::HandleType)12>::operator!(pvVar6);
    if (!bVar4) {
      pDVar1 = this->m_vkd;
      pVVar2 = this->m_device;
      pvVar6 = std::
               vector<vk::Handle<(vk::HandleType)12>,_std::allocator<vk::Handle<(vk::HandleType)12>_>_>
               ::operator[](&this->m_bufferViews,local_18);
      local_20 = pvVar6->m_internal;
      (*pDVar1->_vptr_DeviceInterface[0x24])(pDVar1,pVVar2,local_20,0);
      ::vk::Handle<(vk::HandleType)12>::Handle(&local_28,0);
      pvVar6 = std::
               vector<vk::Handle<(vk::HandleType)12>,_std::allocator<vk::Handle<(vk::HandleType)12>_>_>
               ::operator[](&this->m_bufferViews,local_18);
      pvVar6->m_internal = local_28.m_internal;
    }
    local_18 = local_18 + 1;
  }
  std::vector<vk::Handle<(vk::HandleType)12>,_std::allocator<vk::Handle<(vk::HandleType)12>_>_>::
  ~vector(&this->m_bufferViews);
  std::vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>::
  ~vector(&this->m_descriptorSets);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&this->m_descriptorPool);
  PipelineResources::~PipelineResources(&this->m_resources);
  RenderPassCommand::~RenderPassCommand(&this->super_RenderPassCommand);
  return;
}

Assistant:

RenderFragmentUniformTexelBuffer::~RenderFragmentUniformTexelBuffer (void)
{
	for (size_t bufferViewNdx = 0; bufferViewNdx < m_bufferViews.size(); bufferViewNdx++)
	{
		if (!!m_bufferViews[bufferViewNdx])
		{
			m_vkd->destroyBufferView(m_device, m_bufferViews[bufferViewNdx], DE_NULL);
			m_bufferViews[bufferViewNdx] = (vk::VkBufferView)0;
		}
	}
}